

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

TString * createstrobj(lua_State *L,size_t totalsize,lu_byte tag,uint h)

{
  TString *pTVar1;
  GCObject *o;
  TString *ts;
  uint h_local;
  lu_byte tag_local;
  size_t totalsize_local;
  lua_State *L_local;
  
  pTVar1 = (TString *)luaC_newobj(L,tag,totalsize);
  pTVar1->hash = h;
  pTVar1->extra = '\0';
  return pTVar1;
}

Assistant:

static TString *createstrobj (lua_State *L, size_t totalsize, lu_byte tag,
                              unsigned h) {
  TString *ts;
  GCObject *o;
  o = luaC_newobj(L, tag, totalsize);
  ts = gco2ts(o);
  ts->hash = h;
  ts->extra = 0;
  return ts;
}